

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.cpp
# Opt level: O0

size_t duckdb_zstd::HIST_count_parallel_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,
                 HIST_checkInput_e check,U32 *workSpace)

{
  U32 UVar1;
  U32 UVar2;
  size_t __n;
  long in_RCX;
  ulong uVar3;
  void *in_RDX;
  uint *in_RSI;
  void *in_RDI;
  int in_R8D;
  void *in_R9;
  uint maxSymbolValue;
  U32 s;
  U32 c;
  U32 cached;
  U32 *Counting4;
  U32 *Counting3;
  U32 *Counting2;
  U32 *Counting1;
  uint max;
  size_t countSize;
  BYTE *iend;
  BYTE *ip;
  uint local_88;
  uint local_84;
  uint local_7c;
  uint local_54;
  byte *local_40;
  ulong local_8;
  
  __n = (ulong)(*in_RSI + 1) << 2;
  local_54 = 0;
  if (in_RCX == 0) {
    memset(in_RDI,0,__n);
    *in_RSI = 0;
    local_8 = 0;
  }
  else {
    memset(in_R9,0,0x1000);
    local_7c = MEM_read32(in_RDX);
    local_40 = (byte *)((long)in_RDX + 4);
    while (local_40 < (byte *)((long)in_RDX + in_RCX) + -0xf) {
      UVar1 = MEM_read32(local_40);
      *(int *)((long)in_R9 + (ulong)(local_7c & 0xff) * 4) =
           *(int *)((long)in_R9 + (ulong)(local_7c & 0xff) * 4) + 1;
      uVar3 = (ulong)(local_7c >> 8 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x400) = *(int *)((long)in_R9 + uVar3 * 4 + 0x400) + 1;
      uVar3 = (ulong)(local_7c >> 0x10 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x800) = *(int *)((long)in_R9 + uVar3 * 4 + 0x800) + 1;
      *(int *)((long)in_R9 + (ulong)(local_7c >> 0x18) * 4 + 0xc00) =
           *(int *)((long)in_R9 + (ulong)(local_7c >> 0x18) * 4 + 0xc00) + 1;
      UVar2 = MEM_read32(local_40 + 4);
      *(int *)((long)in_R9 + (ulong)(UVar1 & 0xff) * 4) =
           *(int *)((long)in_R9 + (ulong)(UVar1 & 0xff) * 4) + 1;
      uVar3 = (ulong)(UVar1 >> 8 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x400) = *(int *)((long)in_R9 + uVar3 * 4 + 0x400) + 1;
      uVar3 = (ulong)(UVar1 >> 0x10 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x800) = *(int *)((long)in_R9 + uVar3 * 4 + 0x800) + 1;
      *(int *)((long)in_R9 + (ulong)(UVar1 >> 0x18) * 4 + 0xc00) =
           *(int *)((long)in_R9 + (ulong)(UVar1 >> 0x18) * 4 + 0xc00) + 1;
      UVar1 = MEM_read32(local_40 + 8);
      *(int *)((long)in_R9 + (ulong)(UVar2 & 0xff) * 4) =
           *(int *)((long)in_R9 + (ulong)(UVar2 & 0xff) * 4) + 1;
      uVar3 = (ulong)(UVar2 >> 8 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x400) = *(int *)((long)in_R9 + uVar3 * 4 + 0x400) + 1;
      uVar3 = (ulong)(UVar2 >> 0x10 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x800) = *(int *)((long)in_R9 + uVar3 * 4 + 0x800) + 1;
      *(int *)((long)in_R9 + (ulong)(UVar2 >> 0x18) * 4 + 0xc00) =
           *(int *)((long)in_R9 + (ulong)(UVar2 >> 0x18) * 4 + 0xc00) + 1;
      local_7c = MEM_read32(local_40 + 0xc);
      local_40 = local_40 + 0x10;
      *(int *)((long)in_R9 + (ulong)(UVar1 & 0xff) * 4) =
           *(int *)((long)in_R9 + (ulong)(UVar1 & 0xff) * 4) + 1;
      uVar3 = (ulong)(UVar1 >> 8 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x400) = *(int *)((long)in_R9 + uVar3 * 4 + 0x400) + 1;
      uVar3 = (ulong)(UVar1 >> 0x10 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x800) = *(int *)((long)in_R9 + uVar3 * 4 + 0x800) + 1;
      *(int *)((long)in_R9 + (ulong)(UVar1 >> 0x18) * 4 + 0xc00) =
           *(int *)((long)in_R9 + (ulong)(UVar1 >> 0x18) * 4 + 0xc00) + 1;
    }
    local_40 = local_40 + -4;
    while (local_40 < (byte *)((long)in_RDX + in_RCX)) {
      *(int *)((long)in_R9 + (ulong)*local_40 * 4) =
           *(int *)((long)in_R9 + (ulong)*local_40 * 4) + 1;
      local_40 = local_40 + 1;
    }
    for (local_84 = 0; local_84 < 0x100; local_84 = local_84 + 1) {
      *(int *)((long)in_R9 + (ulong)local_84 * 4) =
           *(int *)((long)in_R9 + (ulong)local_84 * 4 + 0x400) +
           *(int *)((long)in_R9 + (ulong)local_84 * 4 + 0x800) +
           *(int *)((long)in_R9 + (ulong)local_84 * 4 + 0xc00) +
           *(int *)((long)in_R9 + (ulong)local_84 * 4);
      if (local_54 < *(uint *)((long)in_R9 + (ulong)local_84 * 4)) {
        local_54 = *(uint *)((long)in_R9 + (ulong)local_84 * 4);
      }
    }
    local_88 = 0xff;
    while (*(int *)((long)in_R9 + (ulong)local_88 * 4) == 0) {
      local_88 = local_88 - 1;
    }
    if ((in_R8D == 0) || (local_88 <= *in_RSI)) {
      *in_RSI = local_88;
      memmove(in_RDI,in_R9,__n);
      local_8 = (ulong)local_54;
    }
    else {
      local_8 = 0xffffffffffffffd0;
    }
  }
  return local_8;
}

Assistant:

static size_t HIST_count_parallel_wksp(
                                unsigned* count, unsigned* maxSymbolValuePtr,
                                const void* source, size_t sourceSize,
                                HIST_checkInput_e check,
                                U32* const workSpace)
{
    const BYTE* ip = (const BYTE*)source;
    const BYTE* const iend = ip+sourceSize;
    size_t const countSize = (*maxSymbolValuePtr + 1) * sizeof(*count);
    unsigned max=0;
    U32* const Counting1 = workSpace;
    U32* const Counting2 = Counting1 + 256;
    U32* const Counting3 = Counting2 + 256;
    U32* const Counting4 = Counting3 + 256;

    /* safety checks */
    assert(*maxSymbolValuePtr <= 255);
    if (!sourceSize) {
        ZSTD_memset(count, 0, countSize);
        *maxSymbolValuePtr = 0;
        return 0;
    }
    ZSTD_memset(workSpace, 0, 4*256*sizeof(unsigned));

    /* by stripes of 16 bytes */
    {   U32 cached = MEM_read32(ip); ip += 4;
        while (ip < iend-15) {
            U32 c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
        }
        ip-=4;
    }

    /* finish last symbols */
    while (ip<iend) Counting1[*ip++]++;

    {   U32 s;
        for (s=0; s<256; s++) {
            Counting1[s] += Counting2[s] + Counting3[s] + Counting4[s];
            if (Counting1[s] > max) max = Counting1[s];
    }   }

    {   unsigned maxSymbolValue = 255;
        while (!Counting1[maxSymbolValue]) maxSymbolValue--;
        if (check && maxSymbolValue > *maxSymbolValuePtr) return ERROR(maxSymbolValue_tooSmall);
        *maxSymbolValuePtr = maxSymbolValue;
        ZSTD_memmove(count, Counting1, countSize);   /* in case count & Counting1 are overlapping */
    }
    return (size_t)max;
}